

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib.c
# Opt level: O0

int snprintf_long_canframe(char *buf,size_t size,cu_t *cu,int view)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  uint in_ECX;
  uint *in_RDX;
  long in_RSI;
  char *in_RDI;
  uchar dlc;
  int len;
  size_t maxsize;
  int offset;
  int dlen;
  int j;
  int i;
  uchar is_canfd;
  uint local_50;
  uint local_4c;
  byte local_45;
  uint local_44;
  ulong local_40;
  int local_38;
  uint local_34;
  int local_30;
  uint local_2c;
  int local_4;
  
  cVar1 = *(char *)((long)in_RDX + 5);
  local_4 = (int)in_RSI;
  if (in_RSI != 0) {
    if ((in_RDX[1] & 0x80) == 0) {
      if (cVar1 == '\0') {
        if ((byte)in_RDX[1] < 9) {
          local_50 = (uint)(byte)in_RDX[1];
        }
        else {
          local_50 = 8;
        }
        local_44 = local_50;
      }
      else {
        if ((byte)in_RDX[1] < 0x41) {
          local_4c = (uint)(byte)in_RDX[1];
        }
        else {
          local_4c = 0x40;
        }
        local_44 = local_4c;
      }
      if ((in_ECX & 2) == 0) {
        local_34 = 3;
      }
      else {
        local_34 = 9;
      }
      if ((*in_RDX & 0x40000000) == 0) {
        lVar4 = (long)(int)(local_44 * local_34);
        local_40 = lVar4 + 0x11;
        if (local_44 < 9) {
          if ((*in_RDX & 0x20000000) == 0) {
            if ((in_ECX & 1) != 0) {
              local_40 = (long)(int)((8 - local_44) * local_34) + lVar4 + 0x20;
            }
          }
          else {
            local_40 = (long)(int)((8 - local_44) * local_34) + lVar4 + 0x20;
          }
        }
      }
      else {
        local_40 = 0x24;
      }
      if (in_RSI - 1U < local_40) {
        memset(in_RDI,0x2d,in_RSI - 1);
        in_RDI[in_RSI + -1] = '\0';
      }
      else {
        memset(in_RDI,0x20,0xf);
        if ((*in_RDX & 0x20000000) == 0) {
          if ((*in_RDX & 0x80000000) == 0) {
            if ((in_ECX & 0x10) == 0) {
              _put_id(in_RDI,2,*in_RDX & 0x7ff);
              local_38 = 5;
            }
            else {
              _put_id(in_RDI + 5,2,*in_RDX & 0x7ff);
              local_38 = 10;
            }
          }
          else {
            _put_id(in_RDI,7,*in_RDX & 0x1fffffff);
            local_38 = 10;
          }
        }
        else {
          _put_id(in_RDI,7,*in_RDX & 0x3fffffff);
          local_38 = 10;
        }
        if (cVar1 == '\0') {
          if ((in_ECX & 0x20) == 0) {
            in_RDI[local_38 + 1] = '[';
            in_RDI[local_38 + 2] = (byte)local_44 + 0x30;
            in_RDI[local_38 + 3] = ']';
          }
          else {
            local_45 = *(byte *)((long)in_RDX + 7);
            if (((local_44 != 8) || (local_45 < 9)) || (0xf < local_45)) {
              local_45 = (byte)local_44;
            }
            in_RDI[local_38 + 1] = '{';
            in_RDI[local_38 + 2] = "0123456789ABCDEF"[local_45];
            in_RDI[local_38 + 3] = '}';
          }
          if ((*in_RDX & 0x40000000) != 0) {
            iVar2 = sprintf(in_RDI + (long)local_38 + 5," remote request");
            return iVar2 + local_38 + 5;
          }
        }
        else {
          in_RDI[local_38] = '[';
          in_RDI[local_38 + 1] = (char)(local_44 / 10) + '0';
          in_RDI[local_38 + 2] = (char)(local_44 % 10) + '0';
          in_RDI[local_38 + 3] = ']';
        }
        local_38 = local_38 + 5;
        local_2c = local_44;
        if ((in_ECX & 2) == 0) {
          if ((in_ECX & 4) == 0) {
            for (local_2c = 0; (int)local_2c < (int)local_44; local_2c = local_2c + 1) {
              in_RDI[local_38] = ' ';
              put_hex_byte(in_RDI + (local_38 + 1),*(__u8 *)((long)in_RDX + (long)(int)local_2c + 8)
                          );
              local_38 = local_38 + 3;
            }
          }
          else {
            while (iVar2 = local_38, local_2c = local_2c - 1, -1 < (int)local_2c) {
              if (local_2c == local_44 - 1) {
                in_RDI[local_38] = ' ';
              }
              else {
                in_RDI[local_38] = '`';
              }
              local_38 = local_38 + 1;
              put_hex_byte(in_RDI + local_38,*(__u8 *)((long)in_RDX + (long)(int)local_2c + 8));
              local_38 = iVar2 + 3;
            }
          }
        }
        else if ((in_ECX & 4) == 0) {
          for (local_2c = 0; (int)local_2c < (int)local_44; local_2c = local_2c + 1) {
            in_RDI[local_38] = ' ';
            for (local_30 = 7; local_38 = local_38 + 1, -1 < local_30; local_30 = local_30 + -1) {
              cVar1 = '0';
              if ((1 << ((byte)local_30 & 0x1f) &
                  (uint)*(byte *)((long)in_RDX + (long)(int)local_2c + 8)) != 0) {
                cVar1 = '1';
              }
              in_RDI[local_38] = cVar1;
            }
          }
        }
        else {
          while (local_2c = local_2c - 1, -1 < (int)local_2c) {
            cVar1 = '`';
            if (local_2c == local_44 - 1) {
              cVar1 = ' ';
            }
            in_RDI[local_38] = cVar1;
            for (local_30 = 7; local_38 = local_38 + 1, -1 < local_30; local_30 = local_30 + -1) {
              cVar1 = '0';
              if ((1 << ((byte)local_30 & 0x1f) &
                  (uint)*(byte *)((long)in_RDX + (long)(int)local_2c + 8)) != 0) {
                cVar1 = '1';
              }
              in_RDI[local_38] = cVar1;
            }
          }
        }
        in_RDI[local_38] = '\0';
        if (local_44 < 9) {
          if ((*in_RDX & 0x20000000) == 0) {
            if ((in_ECX & 1) != 0) {
              uVar3 = local_34 * (8 - local_44) + 4;
              if ((in_ECX & 4) == 0) {
                sprintf(in_RDI + local_38,"%*s",(ulong)uVar3,"\'");
                local_38 = uVar3 + local_38;
                for (local_2c = 0; (int)local_2c < (int)local_44; local_2c = local_2c + 1) {
                  if ((*(byte *)((long)in_RDX + (long)(int)local_2c + 8) < 0x20) ||
                     (0x7e < *(byte *)((long)in_RDX + (long)(int)local_2c + 8))) {
                    in_RDI[local_38] = '.';
                  }
                  else {
                    in_RDI[local_38] = *(char *)((long)in_RDX + (long)(int)local_2c + 8);
                  }
                  local_38 = local_38 + 1;
                }
                iVar2 = sprintf(in_RDI + local_38,"\'");
                local_38 = iVar2 + local_38;
              }
              else {
                sprintf(in_RDI + local_38,"%*s",(ulong)uVar3,"`");
                local_38 = uVar3 + local_38;
                while (local_2c = local_44 - 1, -1 < (int)local_2c) {
                  if ((*(byte *)((long)in_RDX + (long)(int)local_2c + 8) < 0x20) ||
                     (0x7e < *(byte *)((long)in_RDX + (long)(int)local_2c + 8))) {
                    in_RDI[local_38] = '.';
                  }
                  else {
                    in_RDI[local_38] = *(char *)((long)in_RDX + (long)(int)local_2c + 8);
                  }
                  local_38 = local_38 + 1;
                  local_44 = local_2c;
                }
                iVar2 = sprintf(in_RDI + local_38,"`");
                local_38 = iVar2 + local_38;
              }
            }
          }
          else {
            iVar2 = sprintf(in_RDI + local_38,"%*s",(ulong)(local_34 * (8 - local_44) + 0xd),
                            "ERRORFRAME");
            local_38 = iVar2 + local_38;
          }
          local_4 = local_38;
        }
        else {
          local_4 = local_38;
        }
      }
    }
    else {
      uVar3 = (uint)*(ushort *)((long)in_RDX + 6);
      local_34 = uVar3;
      if (0x40 < uVar3) {
        local_34 = 0x40;
      }
      if (in_RSI - 1U < (long)(int)(local_34 * 3) + 0x29U) {
        memset(in_RDI,0x2d,in_RSI - 1);
        in_RDI[in_RSI + -1] = '\0';
      }
      else {
        if ((in_ECX & 0x10) == 0) {
          _put_id(in_RDI,2,*in_RDX & 0x7ff);
          local_38 = 3;
        }
        else {
          memset(in_RDI,0x20,5);
          _put_id(in_RDI + 5,2,*in_RDX & 0x7ff);
          local_38 = 8;
        }
        iVar2 = sprintf(in_RDI + local_38," [%04d] (%02X|%02X:%02X:%08X) ",(ulong)uVar3,
                        (ulong)((*in_RDX & 0xff0000) >> 0x10),(ulong)(byte)in_RDX[1],
                        (ulong)*(byte *)((long)in_RDX + 5),in_RDX[2]);
        local_38 = iVar2 + local_38;
        for (local_2c = 0; (int)local_2c < (int)local_34; local_2c = local_2c + 1) {
          put_hex_byte(in_RDI + local_38,*(__u8 *)((long)in_RDX + (long)(int)local_2c + 0xc));
          iVar2 = local_38 + 2;
          if ((int)(local_2c + 1) < (int)local_34) {
            in_RDI[local_38 + 2] = ' ';
            iVar2 = local_38 + 3;
          }
          local_38 = iVar2;
        }
        if (local_34 < *(ushort *)((long)in_RDX + 6)) {
          iVar2 = sprintf(in_RDI + local_38," ...");
          local_38 = iVar2 + local_38;
        }
        in_RDI[local_38] = '\0';
        local_4 = local_38;
      }
    }
  }
  return local_4;
}

Assistant:

int snprintf_long_canframe(char *buf, size_t size, cu_t *cu, int view)
{
	/* documentation see lib.h */

	unsigned char is_canfd = cu->fd.flags;
	int i, j, dlen, offset;
	size_t maxsize;
	int len;

	/* ensure space for string termination */
	if (size < 1)
		return size;

	/* handle CAN XL frames */
	if (cu->xl.flags & CANXL_XLF) {
		len = cu->xl.len;

		/* crop to CANFD_MAX_DLEN */
		if (len > CANFD_MAX_DLEN)
			dlen = CANFD_MAX_DLEN;
		else
			dlen = len;

		/* check if the CAN frame fits into the provided buffer */
		if (sizeof(".....123 [2048] (00|11:22:12345678)  ...") + 3 * dlen > size - 1) {
			/* mark buffer overflow in output */
			memset(buf, '-', size - 1);
			buf[size - 1] = 0;
			return size;
		}

		if (view & CANLIB_VIEW_INDENT_SFF) {
			memset(buf, ' ', 5);
			put_sff_id(buf + 5, cu->xl.prio & CANXL_PRIO_MASK);
			offset = 8;
		} else {
			put_sff_id(buf, cu->xl.prio & CANXL_PRIO_MASK);
			offset = 3;
		}

		/* print prio and CAN XL header content */
		offset += sprintf(buf + offset, " [%04d] (%02X|%02X:%02X:%08X) ",
				  len,
				  (canid_t)(cu->xl.prio & CANXL_VCID_MASK) >> CANXL_VCID_OFFSET,
				  cu->xl.flags, cu->xl.sdt, cu->xl.af);

		for (i = 0; i < dlen; i++) {
			put_hex_byte(buf + offset, cu->xl.data[i]);
			offset += 2;
			if (i + 1 < dlen)
				buf[offset++] = ' ';
		}

		/* indicate cropped output */
		if (cu->xl.len > dlen)
			offset += sprintf(buf + offset, " ...");

		buf[offset] = 0;

		return offset;
	}

	/* ensure max length values */
	if (is_canfd)
		len = (cu->fd.len > CANFD_MAX_DLEN) ? CANFD_MAX_DLEN : cu->fd.len;
	else
		len = (cu->fd.len > CAN_MAX_DLEN) ? CAN_MAX_DLEN : cu->fd.len;

	/* check if the CAN frame fits into the provided buffer */
	maxsize = sizeof("12345678  [12]  ");
	if (view & CANLIB_VIEW_BINARY)
		dlen = 9; /* _10101010 */
	else
		dlen = 3; /* _AA */

	if (cu->fd.can_id & CAN_RTR_FLAG) {
		maxsize += sizeof("    remote request");
	} else {
		maxsize += len * dlen;

		if (len <= CAN_MAX_DLEN) {
			if (cu->fd.can_id & CAN_ERR_FLAG) {
				maxsize += sizeof("    ERRORFRAME");
				maxsize += (8 - len) * dlen;
			} else if (view & CANLIB_VIEW_ASCII) {
				maxsize += sizeof("    'a.b.CDEF'");
				maxsize += (8 - len) * dlen;
			}
		}
	}

	if (maxsize > size - 1) {
		/* mark buffer overflow in output */
		memset(buf, '-', size - 1);
		buf[size - 1] = 0;
		return size;
	}

	/* initialize space for CAN-ID and length information */
	memset(buf, ' ', 15);

	if (cu->cc.can_id & CAN_ERR_FLAG) {
		put_eff_id(buf, cu->cc.can_id & (CAN_ERR_MASK | CAN_ERR_FLAG));
		offset = 10;
	} else if (cu->fd.can_id & CAN_EFF_FLAG) {
		put_eff_id(buf, cu->fd.can_id & CAN_EFF_MASK);
		offset = 10;
	} else {
		if (view & CANLIB_VIEW_INDENT_SFF) {
			put_sff_id(buf + 5, cu->fd.can_id & CAN_SFF_MASK);
			offset = 10;
		} else {
			put_sff_id(buf, cu->fd.can_id & CAN_SFF_MASK);
			offset = 5;
		}
	}

	/* The len value is sanitized (see above) */
	if (!is_canfd) {
		if (view & CANLIB_VIEW_LEN8_DLC) {
			unsigned char dlc = cu->cc.len8_dlc;

			/* fall back to len if we don't have a valid DLC > 8 */
			if (!((len == CAN_MAX_DLEN) && (dlc > CAN_MAX_DLEN) &&
			      (dlc <= CAN_MAX_RAW_DLC)))
				dlc = len;

			buf[offset + 1] = '{';
			buf[offset + 2] = hex_asc_upper[dlc];
			buf[offset + 3] = '}';
		} else {
			buf[offset + 1] = '[';
			buf[offset + 2] = len + '0';
			buf[offset + 3] = ']';
		}

		/* standard CAN frames may have RTR enabled */
		if (cu->fd.can_id & CAN_RTR_FLAG) {
			offset += sprintf(buf + offset + 5, " remote request");
			return offset + 5;
		}
	} else {
		buf[offset] = '[';
		buf[offset + 1] = (len / 10) + '0';
		buf[offset + 2] = (len % 10) + '0';
		buf[offset + 3] = ']';
	}
	offset += 5;

	if (view & CANLIB_VIEW_BINARY) {
		/* _10101010 - dlen = 9, see above */
		if (view & CANLIB_VIEW_SWAP) {
			for (i = len - 1; i >= 0; i--) {
				buf[offset++] = (i == len - 1) ? ' ' : SWAP_DELIMITER;
				for (j = 7; j >= 0; j--)
					buf[offset++] = (1 << j & cu->fd.data[i]) ? '1' : '0';
			}
		} else {
			for (i = 0; i < len; i++) {
				buf[offset++] = ' ';
				for (j = 7; j >= 0; j--)
					buf[offset++] = (1 << j & cu->fd.data[i]) ? '1' : '0';
			}
		}
	} else {
		/* _AA - dlen = 3, see above */
		if (view & CANLIB_VIEW_SWAP) {
			for (i = len - 1; i >= 0; i--) {
				if (i == len - 1)
					buf[offset++] = ' ';
				else
					buf[offset++] = SWAP_DELIMITER;

				put_hex_byte(buf + offset, cu->fd.data[i]);
				offset += 2;
			}
		} else {
			for (i = 0; i < len; i++) {
				buf[offset++] = ' ';
				put_hex_byte(buf + offset, cu->fd.data[i]);
				offset += 2;
			}
		}
	}

	buf[offset] = 0; /* terminate string */

	/*
	 * The ASCII & ERRORFRAME output is put at a fixed len behind the data.
	 * For now we support ASCII output only for payload length up to 8 bytes.
	 * Does it make sense to write 64 ASCII byte behind 64 ASCII HEX data on the console?
	 */
	if (len > CAN_MAX_DLEN)
		return offset;

	if (cu->fd.can_id & CAN_ERR_FLAG)
		offset += sprintf(buf + offset, "%*s", dlen * (8 - len) + 13, "ERRORFRAME");
	else if (view & CANLIB_VIEW_ASCII) {
		j = dlen * (8 - len) + 4;
		if (view & CANLIB_VIEW_SWAP) {
			sprintf(buf + offset, "%*s", j, "`");
			offset += j;
			for (i = len - 1; i >= 0; i--)
				if ((cu->fd.data[i] > 0x1F) && (cu->fd.data[i] < 0x7F))
					buf[offset++] = cu->fd.data[i];
				else
					buf[offset++] = '.';

			offset += sprintf(buf + offset, "`");
		} else {
			sprintf(buf + offset, "%*s", j, "'");
			offset += j;
			for (i = 0; i < len; i++)
				if ((cu->fd.data[i] > 0x1F) && (cu->fd.data[i] < 0x7F))
					buf[offset++] = cu->fd.data[i];
				else
					buf[offset++] = '.';

			offset += sprintf(buf + offset, "'");
		}
	}

	return offset;
}